

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:365:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:365:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  bool bVar1;
  native_error_exception *this_00;
  global_object *this_01;
  pointer pvVar2;
  pointer pvVar3;
  ulong uVar4;
  long lVar5;
  wstring_view wVar6;
  wstring local_230;
  wstring_view local_210;
  wchar_t *local_200;
  size_t local_1f8;
  value val;
  wstring_view local_1b8;
  wostringstream woss;
  
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar2 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar2 = (pointer)&value::undefined;
  }
  value::value(&val,pvVar2);
  bVar1 = to_boolean(&val);
  if (bVar1) {
    value::value(__return_storage_ptr__,(value *)&value::undefined);
    value::~value(&val);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)(((long)pvVar3 - (long)pvVar2) / 0x28) < 2) {
    debug_print((wostream *)&woss,&val,4,0x7fffffff,0);
    std::operator<<((wostream *)&woss," == true");
  }
  else {
    h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
    uVar4 = 1;
    lVar5 = 0x28;
    while( true ) {
      if ((ulong)(((long)pvVar3 - (long)pvVar2) / 0x28) <= uVar4) break;
      if (1 < uVar4) {
        std::operator<<((wostream *)&woss," ");
        pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      to_string((mjs *)&local_230,h,(value *)((long)&pvVar2->type_ + lVar5));
      wVar6 = string::view((string *)&local_230);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                ((wostream *)&woss,wVar6._M_str,wVar6._M_len);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_230);
      uVar4 = uVar4 + 1;
      pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x28;
    }
  }
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::stack_trace_abi_cxx11_(&local_230,this_01);
  local_210._M_len = local_230._M_string_length;
  local_210._M_str = local_230._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b8._M_len = local_1f8;
  local_1b8._M_str = local_200;
  native_error_exception::native_error_exception(this_00,assertion,&local_210,&local_1b8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }